

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

void __thiscall
flatbuffers::go::GoGenerator::GetStringField
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  undefined8 *puVar1;
  long *plVar2;
  ulong *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  long *local_b0;
  long local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[6])(&local_90,&this->namer_,field);
  puVar1 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x376aab);
  plVar2 = puVar1 + 2;
  if ((long *)*puVar1 == plVar2) {
    local_a0 = *plVar2;
    uStack_98 = puVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
    local_b0 = (long *)*puVar1;
  }
  *puVar1 = plVar2;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  TypeName_abi_cxx11_(&local_70,this,field);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x37528d);
  puVar3 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar3) {
    local_80 = *puVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar3;
    local_90 = (ulong *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)puVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  puVar1 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  plVar2 = puVar1 + 2;
  if ((long *)*puVar1 == plVar2) {
    local_a0 = *plVar2;
    uStack_98 = puVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
    local_b0 = (long *)*puVar1;
  }
  *puVar1 = plVar2;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  OffsetPrefix_abi_cxx11_(&local_70,this,field);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar3 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar3) {
    local_80 = *puVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar3;
    local_90 = (ulong *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)puVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  GenGetter_abi_cxx11_(&local_50,this,&(field->value).type);
  uVar4 = 0xf;
  if (local_90 != &local_80) {
    uVar4 = local_80;
  }
  if (uVar4 < local_50._M_string_length + local_88) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar5 = local_50.field_2._M_allocated_capacity;
    }
    if (local_50._M_string_length + local_88 <= (ulong)uVar5) {
      puVar1 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_90);
      goto LAB_00213783;
    }
  }
  puVar1 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50._M_dataplus._M_p);
LAB_00213783:
  plVar2 = puVar1 + 2;
  if ((long *)*puVar1 == plVar2) {
    local_a0 = *plVar2;
    uStack_98 = puVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
    local_b0 = (long *)*puVar1;
  }
  *puVar1 = plVar2;
  puVar1[1] = 0;
  *(undefined1 *)plVar2 = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void GetStringField(const StructDef &struct_def, const FieldDef &field,
                      std::string *code_ptr) {
    std::string &code = *code_ptr;
    GenReceiver(struct_def, code_ptr);
    code += " " + namer_.Function(field);
    code += "() " + TypeName(field) + " ";
    code += OffsetPrefix(field) + "\t\treturn " + GenGetter(field.value.type);
    code += "(o + rcv._tab.Pos)\n\t}\n\treturn nil\n";
    code += "}\n\n";
  }